

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O0

bool __thiscall libcellml::ComponentEntity::removeComponent(ComponentEntity *this,size_t index)

{
  ComponentEntityImpl *pCVar1;
  size_type sVar2;
  reference pvVar3;
  ComponentEntityImpl *pCVar4;
  element_type *this_00;
  ComponentImpl *this_01;
  __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_58;
  __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_50;
  const_iterator local_48;
  undefined1 local_30 [8];
  value_type component;
  bool status;
  size_t index_local;
  ComponentEntity *this_local;
  
  component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 0;
  pCVar1 = pFunc(this);
  sVar2 = std::
          vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
          ::size(&pCVar1->mComponents);
  if (index < sVar2) {
    pCVar1 = pFunc(this);
    pvVar3 = std::
             vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             ::operator[](&pCVar1->mComponents,index);
    std::shared_ptr<libcellml::Component>::shared_ptr
              ((shared_ptr<libcellml::Component> *)local_30,pvVar3);
    pCVar1 = pFunc(this);
    pCVar4 = pFunc(this);
    local_58._M_current =
         (shared_ptr<libcellml::Component> *)
         std::
         vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
         ::begin(&pCVar4->mComponents);
    local_50 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
               ::operator+(&local_58,index);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Component>const*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>
    ::__normal_iterator<std::shared_ptr<libcellml::Component>*>
              ((__normal_iterator<std::shared_ptr<libcellml::Component>const*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>
                *)&local_48,&local_50);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::erase(&pCVar1->mComponents,local_48);
    this_00 = std::
              __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30);
    this_01 = Component::pFunc(this_00);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_01);
    component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._7_1_ = 1;
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_30)
    ;
  }
  return (bool)(component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._7_1_ & 1);
}

Assistant:

bool ComponentEntity::removeComponent(size_t index)
{
    bool status = false;
    if (index < pFunc()->mComponents.size()) {
        auto component = pFunc()->mComponents[index];
        pFunc()->mComponents.erase(pFunc()->mComponents.begin() + ptrdiff_t(index));
        component->pFunc()->removeParent();
        status = true;
    }

    return status;
}